

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeDelete(Vdbe *p)

{
  sqlite3 *db;
  SubProgram *pSVar1;
  Vdbe *pVVar2;
  Vdbe *pVVar3;
  SubProgram *p_00;
  Vdbe **ppVVar4;
  
  db = p->db;
  if (p->aColName != (Mem *)0x0) {
    releaseMemArray(p->aColName,(uint)p->nResColumn + (uint)p->nResColumn * 4);
    sqlite3DbFreeNN(db,p->aColName);
  }
  p_00 = p->pProgram;
  while (p_00 != (SubProgram *)0x0) {
    pSVar1 = p_00->pNext;
    vdbeFreeOpArray(db,p_00->aOp,p_00->nOp);
    sqlite3DbFreeNN(db,p_00);
    p_00 = pSVar1;
  }
  if (p->eVdbeState != '\0') {
    releaseMemArray(p->aVar,(int)p->nVar);
    if (p->pVList != (VList *)0x0) {
      sqlite3DbFreeNN(db,p->pVList);
    }
    if (p->pFree != (void *)0x0) {
      sqlite3DbFreeNN(db,p->pFree);
    }
  }
  vdbeFreeOpArray(db,p->aOp,p->nOp);
  if (p->zSql != (char *)0x0) {
    sqlite3DbFreeNN(db,p->zSql);
  }
  if (db->pnBytesFreed == (int *)0x0) {
    pVVar2 = p->pPrev;
    pVVar3 = p->pNext;
    ppVVar4 = &pVVar2->pNext;
    if (pVVar2 == (Vdbe *)0x0) {
      ppVVar4 = &db->pVdbe;
    }
    *ppVVar4 = pVVar3;
    if (pVVar3 != (Vdbe *)0x0) {
      pVVar3->pPrev = pVVar2;
    }
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDelete(Vdbe *p){
  sqlite3 *db;

  assert( p!=0 );
  db = p->db;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3VdbeClearObject(db, p);
  if( db->pnBytesFreed==0 ){
    if( p->pPrev ){
      p->pPrev->pNext = p->pNext;
    }else{
      assert( db->pVdbe==p );
      db->pVdbe = p->pNext;
    }
    if( p->pNext ){
      p->pNext->pPrev = p->pPrev;
    }
  }
  sqlite3DbFreeNN(db, p);
}